

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprIfTrue(Parse *pParse,Expr *pExpr,int dest,int jumpIfNull)

{
  Vdbe *p;
  Expr *pExpr_00;
  int *piVar1;
  u8 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Select *pSVar7;
  int regFree1;
  int regFree2;
  
  p = pParse->pVdbe;
  _regFree1 = 0;
  if (pExpr == (Expr *)0x0 || p == (Vdbe *)0x0) {
    return;
  }
  uVar3 = (uint)pExpr->op;
  switch(pExpr->op) {
  case 'F':
    sqlite3ExprIfTrue(pParse,pExpr->pLeft,dest,jumpIfNull);
    pParse->iCacheLevel = pParse->iCacheLevel + 1;
    sqlite3ExprIfTrue(pParse,pExpr->pRight,dest,jumpIfNull);
    break;
  case 'G':
    uVar3 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
    sqlite3ExprIfFalse(pParse,pExpr->pLeft,uVar3,jumpIfNull ^ 0x10);
    pParse->iCacheLevel = pParse->iCacheLevel + 1;
    sqlite3ExprIfTrue(pParse,pExpr->pRight,dest,jumpIfNull);
    piVar1 = p->pParse->aLabel;
    if (piVar1 != (int *)0x0) {
      piVar1[(int)~uVar3] = p->nOp;
    }
    break;
  case 'H':
switchD_0015fd59_caseD_48:
    uVar3 = (uVar3 == 0x48) + 0x4d;
    jumpIfNull = 0x80;
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
    pExpr_00 = pExpr->pLeft;
    uVar2 = pExpr_00->op;
    if (uVar2 == 0x9d) {
      uVar2 = pExpr_00->op2;
    }
    if (uVar2 == 'w') {
      pSVar7 = (pExpr_00->x).pSelect;
LAB_0015fdc9:
      if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar7->pEList)->pList->nExpr) {
LAB_0015fe20:
        iVar4 = exprAlwaysTrue(pExpr);
        if (iVar4 == 0) {
          iVar4 = exprAlwaysFalse(pExpr);
          iVar5 = 0;
          if (iVar4 != 0) goto LAB_0015ff96;
          iVar4 = sqlite3ExprCodeTemp(pParse,pExpr,&regFree1);
          uVar6 = (uint)(jumpIfNull != 0);
          uVar3 = 0x15;
        }
        else {
          uVar3 = 0xd;
          iVar4 = 0;
LAB_0015fe3e:
          uVar6 = 0;
        }
        iVar5 = 0;
        sqlite3VdbeAddOp3(p,uVar3,iVar4,dest,uVar6);
        goto LAB_0015ff96;
      }
    }
    else if (uVar2 == 0x9e) {
      pSVar7 = (Select *)&pExpr_00->x;
      goto LAB_0015fdc9;
    }
    iVar4 = sqlite3ExprCodeTemp(pParse,pExpr_00,&regFree1);
    iVar5 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    codeCompare(pParse,pExpr->pLeft,pExpr->pRight,uVar3,iVar4,iVar5,dest,jumpIfNull);
    iVar5 = regFree2;
    goto LAB_0015ff96;
  case 'I':
    exprCodeBetween(pParse,pExpr,dest,sqlite3ExprIfTrue,jumpIfNull);
    goto LAB_0015ff93;
  case 'J':
    uVar6 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
    uVar3 = dest;
    if (jumpIfNull == 0) {
      uVar3 = uVar6;
    }
    sqlite3ExprCodeIN(pParse,pExpr,uVar6,uVar3);
    iVar5 = 0;
    sqlite3VdbeAddOp3(p,0xd,0,dest,0);
    piVar1 = p->pParse->aLabel;
    if (piVar1 != (int *)0x0) {
      piVar1[(int)~uVar6] = p->nOp;
    }
    goto LAB_0015ff96;
  case 'K':
  case 'L':
    iVar4 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    goto LAB_0015fe3e;
  default:
    if (uVar3 == 0x13) {
      sqlite3ExprIfFalse(pParse,pExpr->pLeft,dest,jumpIfNull);
      goto LAB_0015ff93;
    }
    if (uVar3 == 0x94) goto switchD_0015fd59_caseD_48;
    goto LAB_0015fe20;
  }
  sqlite3ExprCachePop(pParse);
LAB_0015ff93:
  iVar5 = 0;
LAB_0015ff96:
  sqlite3ReleaseTempReg(pParse,regFree1);
  sqlite3ReleaseTempReg(pParse,iVar5);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprIfTrue(Parse *pParse, Expr *pExpr, int dest, int jumpIfNull){
  Vdbe *v = pParse->pVdbe;
  int op = 0;
  int regFree1 = 0;
  int regFree2 = 0;
  int r1, r2;

  assert( jumpIfNull==SQLITE_JUMPIFNULL || jumpIfNull==0 );
  if( NEVER(v==0) )     return;  /* Existence of VDBE checked by caller */
  if( NEVER(pExpr==0) ) return;  /* No way this can happen */
  op = pExpr->op;
  switch( op ){
    case TK_AND: {
      int d2 = sqlite3VdbeMakeLabel(v);
      testcase( jumpIfNull==0 );
      sqlite3ExprIfFalse(pParse, pExpr->pLeft, d2,jumpIfNull^SQLITE_JUMPIFNULL);
      sqlite3ExprCachePush(pParse);
      sqlite3ExprIfTrue(pParse, pExpr->pRight, dest, jumpIfNull);
      sqlite3VdbeResolveLabel(v, d2);
      sqlite3ExprCachePop(pParse);
      break;
    }
    case TK_OR: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest, jumpIfNull);
      sqlite3ExprCachePush(pParse);
      sqlite3ExprIfTrue(pParse, pExpr->pRight, dest, jumpIfNull);
      sqlite3ExprCachePop(pParse);
      break;
    }
    case TK_NOT: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest, jumpIfNull);
      break;
    }
    case TK_IS:
    case TK_ISNOT:
      testcase( op==TK_IS );
      testcase( op==TK_ISNOT );
      op = (op==TK_IS) ? TK_EQ : TK_NE;
      jumpIfNull = SQLITE_NULLEQ;
      /* Fall thru */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      if( sqlite3ExprIsVector(pExpr->pLeft) ) goto default_expr;
      testcase( jumpIfNull==0 );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, jumpIfNull);
      assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
      assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
      assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
      assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
      assert(TK_EQ==OP_Eq); testcase(op==OP_Eq);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull==SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull!=SQLITE_NULLEQ);
      assert(TK_NE==OP_Ne); testcase(op==OP_Ne);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull==SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull!=SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      assert( TK_ISNULL==OP_IsNull );   testcase( op==TK_ISNULL );
      assert( TK_NOTNULL==OP_NotNull ); testcase( op==TK_NOTNULL );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      sqlite3VdbeAddOp2(v, op, r1, dest);
      VdbeCoverageIf(v, op==TK_ISNULL);
      VdbeCoverageIf(v, op==TK_NOTNULL);
      testcase( regFree1==0 );
      break;
    }
    case TK_BETWEEN: {
      testcase( jumpIfNull==0 );
      exprCodeBetween(pParse, pExpr, dest, sqlite3ExprIfTrue, jumpIfNull);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_IN: {
      int destIfFalse = sqlite3VdbeMakeLabel(v);
      int destIfNull = jumpIfNull ? dest : destIfFalse;
      sqlite3ExprCodeIN(pParse, pExpr, destIfFalse, destIfNull);
      sqlite3VdbeGoto(v, dest);
      sqlite3VdbeResolveLabel(v, destIfFalse);
      break;
    }
#endif
    default: {
    default_expr:
      if( exprAlwaysTrue(pExpr) ){
        sqlite3VdbeGoto(v, dest);
      }else if( exprAlwaysFalse(pExpr) ){
        /* No-op */
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pExpr, &regFree1);
        sqlite3VdbeAddOp3(v, OP_If, r1, dest, jumpIfNull!=0);
        VdbeCoverage(v);
        testcase( regFree1==0 );
        testcase( jumpIfNull==0 );
      }
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);  
}